

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plane.cpp
# Opt level: O3

void __thiscall Plane::Plane(Plane *this,double a,double b,double c,double d)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  GeometricObject::GeometricObject(&this->super_GeometricObject);
  (this->super_GeometricObject)._vptr_GeometricObject = (_func_int **)&PTR__GeometricObject_00108bd0
  ;
  dVar2 = SQRT(c * c + a * a + b * b);
  auVar3._8_8_ = b;
  auVar3._0_8_ = a;
  auVar4._8_8_ = dVar2;
  auVar4._0_8_ = dVar2;
  auVar4 = divpd(auVar3,auVar4);
  (this->normal).x = (double)auVar4._0_8_;
  (this->normal).y = (double)auVar4._8_8_;
  auVar5._8_8_ = d;
  auVar5._0_8_ = c;
  auVar1._8_8_ = dVar2;
  auVar1._0_8_ = dVar2;
  auVar4 = divpd(auVar5,auVar1);
  *(undefined1 (*) [16])&(this->normal).z = auVar4;
  return;
}

Assistant:

Plane::Plane( double a, double b, double c,  double d )
{
   normal = Vector(a,b,c);
   double norm = !normal;

   normal /= norm;
   dist = d / norm;
}